

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  anon_class_8_1_c61d8849 fileSearch;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_32_1_898f2789_for__M_pred fileMatch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_c61d8849 local_128;
  anon_class_8_1_60cb577c local_120;
  long *local_118 [2];
  long local_108 [2];
  undefined1 local_f8 [8];
  long *local_f0;
  long local_e0 [2];
  undefined1 local_d0 [168];
  
  memset(local_d0,0,0xa8);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_f8 = (undefined1  [8])local_d0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + name->_M_string_length);
  local_120.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)local_f8;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,pcVar1,pcVar1 + name->_M_string_length);
  local_128.fileMatch = (anon_class_32_1_898f2789_for__M_pred *)local_118;
  bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                    (&local_128,&this->PostExcludeFilesStrict);
  bVar3 = true;
  if (!bVar2) {
    bVar2 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                      (&local_120,&this->PostIncludeRegexes);
    if (!bVar2) {
      bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                        (&local_128,&this->PostIncludeFiles);
      if (!bVar2) {
        bVar2 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                          (&local_120,&this->PostExcludeRegexes);
        if (!bVar2) {
          bVar3 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                            (&local_128,&this->PostExcludeFiles);
        }
        goto LAB_004adff0;
      }
    }
    bVar3 = false;
  }
LAB_004adff0:
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  return bVar3;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };
  auto const fileMatch = [name](const std::string& file) -> bool {
    return cmSystemTools::SameFile(file, name);
  };
  auto const fileSearch =
    [&fileMatch](const std::vector<std::string>& files) -> bool {
    return std::any_of(files.begin(), files.end(), fileMatch);
  };

  return fileSearch(this->PostExcludeFilesStrict) ||
    (!(regexSearch(this->PostIncludeRegexes) ||
       fileSearch(this->PostIncludeFiles)) &&
     (regexSearch(this->PostExcludeRegexes) ||
      fileSearch(this->PostExcludeFiles)));
}